

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcScorr.c
# Opt level: O0

Vec_Int_t * Abc_NtkMapGiaIntoNameId(Abc_Ntk_t *pNetlist,Aig_Man_t *pAig,Gia_Man_t *pGia)

{
  int iVar1;
  Aig_Type_t AVar2;
  uint uVar3;
  Vec_Int_t *p;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  int local_5c;
  int local_4c;
  int i;
  Aig_Obj_t *pObjAig;
  Abc_Obj_t *pAnd;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pNet;
  Vec_Int_t *vId2Name;
  Gia_Man_t *pGia_local;
  Aig_Man_t *pAig_local;
  Abc_Ntk_t *pNetlist_local;
  
  p = Vec_IntAlloc(0);
  if (pGia == (Gia_Man_t *)0x0) {
    local_5c = Aig_ManObjNumMax(pAig);
  }
  else {
    local_5c = Gia_ManObjNum(pGia);
  }
  Vec_IntFill(p,local_5c,-1);
  for (local_4c = 0; iVar1 = Vec_PtrSize(pNetlist->vObjs), local_4c < iVar1; local_4c = local_4c + 1
      ) {
    pAVar4 = Abc_NtkObj(pNetlist,local_4c);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNet(pAVar4), iVar1 != 0)) {
      pAVar5 = Abc_ObjFanin0(pAVar4);
      if (((pAVar5->field_6).pCopy != (Abc_Obj_t *)0x0) &&
         (((pAVar5 = Abc_ObjRegular((((pAVar5->field_6).pCopy)->field_6).pCopy),
           pAVar5 != (Abc_Obj_t *)0x0 &&
           (pAVar5 = Abc_ObjRegular((pAVar5->field_6).pCopy), pAVar5 != (Abc_Obj_t *)0x0)) &&
          (AVar2 = Aig_ObjType((Aig_Obj_t *)pAVar5), AVar2 != AIG_OBJ_NONE)))) {
        if (pGia == (Gia_Man_t *)0x0) {
          iVar1 = Aig_ObjId((Aig_Obj_t *)pAVar5);
          uVar3 = Abc_ObjId(pAVar4);
          Vec_IntWriteEntry(p,iVar1,uVar3);
        }
        else {
          iVar1 = Abc_Lit2Var((pAVar5->vFanouts).nCap);
          uVar3 = Abc_ObjId(pAVar4);
          Vec_IntWriteEntry(p,iVar1,uVar3);
        }
      }
    }
  }
  for (local_4c = 0; iVar1 = Abc_NtkCoNum(pNetlist), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar4 = Abc_NtkCo(pNetlist,local_4c);
    pAVar5 = Abc_ObjFanin0(pAVar4);
    if ((((pAVar4->field_6).pCopy != (Abc_Obj_t *)0x0) &&
        (pAVar4 = Abc_ObjRegular((((pAVar4->field_6).pCopy)->field_6).pCopy),
        pAVar4 != (Abc_Obj_t *)0x0)) &&
       ((pAVar4 = Abc_ObjRegular((pAVar4->field_6).pCopy), pAVar4 != (Abc_Obj_t *)0x0 &&
        (AVar2 = Aig_ObjType((Aig_Obj_t *)pAVar4), AVar2 != AIG_OBJ_NONE)))) {
      if (pGia == (Gia_Man_t *)0x0) {
        iVar1 = Aig_ObjId((Aig_Obj_t *)pAVar4);
        uVar3 = Abc_ObjId(pAVar5);
        Vec_IntWriteEntry(p,iVar1,uVar3);
      }
      else {
        iVar1 = Abc_Lit2Var((pAVar4->vFanouts).nCap);
        uVar3 = Abc_ObjId(pAVar5);
        Vec_IntWriteEntry(p,iVar1,uVar3);
      }
    }
  }
  for (local_4c = 0; iVar1 = Abc_NtkCiNum(pNetlist), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar4 = Abc_NtkCi(pNetlist,local_4c);
    pAVar5 = Abc_ObjFanout0(pAVar4);
    if ((((pAVar4->field_6).pCopy != (Abc_Obj_t *)0x0) &&
        (pAVar4 = Abc_ObjRegular((((pAVar4->field_6).pCopy)->field_6).pCopy),
        pAVar4 != (Abc_Obj_t *)0x0)) &&
       ((pAVar4 = Abc_ObjRegular((pAVar4->field_6).pCopy), pAVar4 != (Abc_Obj_t *)0x0 &&
        (AVar2 = Aig_ObjType((Aig_Obj_t *)pAVar4), AVar2 != AIG_OBJ_NONE)))) {
      if (pGia == (Gia_Man_t *)0x0) {
        iVar1 = Aig_ObjId((Aig_Obj_t *)pAVar4);
        uVar3 = Abc_ObjId(pAVar5);
        Vec_IntWriteEntry(p,iVar1,uVar3);
      }
      else {
        iVar1 = Abc_Lit2Var((pAVar4->vFanouts).nCap);
        uVar3 = Abc_ObjId(pAVar5);
        Vec_IntWriteEntry(p,iVar1,uVar3);
      }
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkMapGiaIntoNameId( Abc_Ntk_t * pNetlist, Aig_Man_t * pAig, Gia_Man_t * pGia )
{
    Vec_Int_t * vId2Name;
    Abc_Obj_t * pNet, * pNode, * pAnd;
    Aig_Obj_t * pObjAig;
    int i;
    vId2Name = Vec_IntAlloc( 0 );
    Vec_IntFill( vId2Name, pGia ? Gia_ManObjNum(pGia) : Aig_ManObjNumMax(pAig), ~0 );
    // copy all names
    Abc_NtkForEachNet( pNetlist, pNet, i )
    {
        pNode = Abc_ObjFanin0(pNet)->pCopy; 
        if ( pNode && (pAnd = Abc_ObjRegular(pNode->pCopy)) && 
            (pObjAig = (Aig_Obj_t *)Abc_ObjRegular(pAnd->pCopy)) && 
             Aig_ObjType(pObjAig) != AIG_OBJ_NONE )
        {
            if ( pGia == NULL )
                Vec_IntWriteEntry( vId2Name, Aig_ObjId(pObjAig), Abc_ObjId(pNet) );
            else
                Vec_IntWriteEntry( vId2Name, Abc_Lit2Var(pObjAig->iData), Abc_ObjId(pNet) );
        }
    }
    // overwrite CO names
    Abc_NtkForEachCo( pNetlist, pNode, i )
    {
        pNet = Abc_ObjFanin0(pNode);
        pNode = pNode->pCopy;
        if ( pNode && (pAnd = Abc_ObjRegular(pNode->pCopy)) && 
            (pObjAig = (Aig_Obj_t *)Abc_ObjRegular(pAnd->pCopy)) && 
             Aig_ObjType(pObjAig) != AIG_OBJ_NONE )
        {
            if ( pGia == NULL )
                Vec_IntWriteEntry( vId2Name, Aig_ObjId(pObjAig), Abc_ObjId(pNet) );
            else
                Vec_IntWriteEntry( vId2Name, Abc_Lit2Var(pObjAig->iData), Abc_ObjId(pNet) );
        }
    }
    // overwrite CI names
    Abc_NtkForEachCi( pNetlist, pNode, i )
    {
        pNet = Abc_ObjFanout0(pNode);
        pNode = pNode->pCopy;
        if ( pNode && (pAnd = Abc_ObjRegular(pNode->pCopy)) && 
            (pObjAig = (Aig_Obj_t *)Abc_ObjRegular(pAnd->pCopy)) && 
             Aig_ObjType(pObjAig) != AIG_OBJ_NONE )
        {
            if ( pGia == NULL )
                Vec_IntWriteEntry( vId2Name, Aig_ObjId(pObjAig), Abc_ObjId(pNet) );
            else
                Vec_IntWriteEntry( vId2Name, Abc_Lit2Var(pObjAig->iData), Abc_ObjId(pNet) );
        }
    }
    return vId2Name;
}